

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O2

int dwarfstring_append_printf_u(dwarfstring *data,char *format,dwarfstring_u v)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  byte bVar12;
  size_t sVar13;
  long lVar14;
  char *str;
  bool bVar15;
  size_t sStack_70;
  char *endptr;
  char digbuf [36];
  char local_34 [4];
  
  endptr = (char *)0x0;
  if (format == (char *)0x0) {
    pcVar8 = "<DWARFSTRINGERR: null format pointer to dwarfstring_append_printf_u>";
    sStack_70 = 0x44;
  }
  else {
    for (sVar13 = 0; (format[sVar13] != '\0' && (format[sVar13] != '%')); sVar13 = sVar13 + 1) {
    }
    dwarfstring_append_length(data,format,sVar13);
    if (format[sVar13] == '%') {
      cVar1 = format[sVar13 + 1];
      if (cVar1 == '-') {
        pcVar8 = 
        "<DWARFSTRINGERR: format - passed to dwarfstring_append_printf_u cannot be handled>";
        sStack_70 = 0x52;
      }
      else if ((cVar1 == ' ') || (cVar1 == '\0')) {
        pcVar8 = "<DWARFSTRINGERR: empty percent  to dwarfstring_append_printf_u>";
        sStack_70 = 0x3f;
      }
      else {
        lVar14 = sVar13 + 2;
        if (cVar1 != '0') {
          lVar14 = sVar13 + 1;
        }
        uVar5 = strtol(format + lVar14,&endptr,10);
        uVar9 = 0;
        if (endptr != format + lVar14) {
          uVar9 = uVar5;
        }
        uVar6 = (ulong)(*endptr == 'l');
        uVar5 = (ulong)((*endptr == 'l') + 1);
        if (endptr[uVar6] != 'l') {
          uVar5 = uVar6;
        }
        pcVar11 = endptr + (ulong)(endptr[uVar6] == 'l') + (uVar6 - (long)format);
        pcVar8 = pcVar11 + (format[(long)pcVar11] == 'l');
        cVar2 = format[(long)pcVar8];
        cVar3 = format[(long)(pcVar8 + (cVar2 == 'u'))];
        pcVar8 = pcVar8 + (cVar2 == 'u') + (cVar3 == 'd');
        cVar4 = format[(long)pcVar8];
        uVar6 = (ulong)(cVar4 == 'x');
        uVar7 = (ulong)(format[(long)(pcVar8 + uVar6)] == 'X');
        if (format[(long)(pcVar8 + uVar7 + uVar6)] == 's') {
          pcVar8 = 
          "<DWARFSTRINGERR: format percent-s passed to dwarfstring_append_printf_u cannot be handled>"
          ;
          sStack_70 = 0x5a;
        }
        else {
          bVar12 = (cVar2 == 'u') + (cVar3 == 'd') + (cVar4 == 'x') +
                   (format[(long)(pcVar8 + uVar6)] == 'X');
          if (bVar12 < 2) {
            if (bVar12 == 0) {
              pcVar8 = 
              "<DWARFSTRINGERR: format percent x X d u missing to dwarfstring_append_printf_u cannot be handled>"
              ;
              sStack_70 = 0x61;
            }
            else if ((int)uVar5 + (uint)(format[(long)pcVar11] == 'l') < 3) {
              if (cVar3 == 'd') {
                pcVar8 = 
                "<DWARFSTRINGERR: format  percent-d to dwarfstring_append_printf_u cannot be handled>"
                ;
                sStack_70 = 0x54;
              }
              else {
                pcVar11 = "0123456789ABCDEF";
                if (cVar4 == 'x') {
                  pcVar11 = "0123456789abcdef";
                }
                if (cVar2 == 'u') {
                  digbuf[0x23] = '\0';
                  uVar10 = 0;
                  pcVar11 = digbuf + 0x23;
                  do {
                    str = pcVar11 + -1;
                    pcVar11[-1] = "0123456789"[v % 10];
                    uVar10 = uVar10 + 1;
                    bVar15 = 9 < v;
                    pcVar11 = str;
                    v = v / 10;
                  } while (bVar15);
                }
                else {
                  uVar10 = 0;
                  str = local_34;
                  do {
                    str[-1] = pcVar11[(uint)v & 0xf];
                    str = str + -1;
                    uVar10 = uVar10 + 1;
                    bVar15 = 0xf < v;
                    v = v >> 4;
                  } while (bVar15);
                }
                pcVar8 = format + (long)(pcVar8 + uVar7 + uVar6);
                uVar5 = (ulong)uVar10;
                sVar13 = uVar9 - uVar5;
                if (uVar5 <= uVar9 && sVar13 != 0) {
                  if (cVar1 == '0') {
                    _dwarfstring_append_zeros(data,sVar13);
                  }
                  else {
                    _dwarfstring_append_spaces(data,sVar13);
                  }
                }
                dwarfstring_append_length(data,str,uVar5);
                if (*pcVar8 == '\0') {
                  return 0;
                }
                sStack_70 = strlen(pcVar8);
              }
            }
            else {
              pcVar8 = 
              "<DWARFSTRINGERR: format percent lll to dwarfstring_append_printf_u cannot be handled>"
              ;
              sStack_70 = 0x55;
            }
          }
          else {
            pcVar8 = 
            "<DWARFSTRINGERR: format  percent -x X d u repeats to dwarfstring_append_printf_u cannot be handled>"
            ;
            sStack_70 = 99;
          }
        }
      }
    }
    else {
      pcVar8 = "<DWARFSTRINGERR: no percent passed to dwarfstring_append_printf_u>";
      sStack_70 = 0x42;
    }
  }
  dwarfstring_append_length(data,pcVar8,sStack_70);
  return 0;
}

Assistant:

int dwarfstring_append_printf_u(dwarfstring *data,
    char *format,
    dwarfstring_u v)
{

    size_t next = 0;
    long val = 0;
    char *endptr = 0;
    const char *numptr = 0;
    size_t fixedlen = 0;
    int leadingzero = 0;
    int lcount = 0;
    int ucount = 0;
    int dcount = 0;
    int xcount = 0;
    int Xcount = 0;
    char *ctable = 0;
    size_t divisor = 0;
    size_t prefixlen = 0;

    if (!format) {
        DWSERR("<DWARFSTRINGERR: null format pointer to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    while (format[next] && format[next] != '%') {
        ++next;
        ++prefixlen;
    }
    dwarfstring_append_length(data,format,prefixlen);
    if (format[next] != '%') {
        /*   No % operator found, we are done */
        DWSERR("<DWARFSTRINGERR: no percent passed to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    next++;
    if (!format[next]) {
        DWSERR("<DWARFSTRINGERR: empty percent  to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    if (format[next] == ' ') {
        DWSERR("<DWARFSTRINGERR: empty percent  to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    if (format[next] == '-') {
        DWSERR("<DWARFSTRINGERR: format - passed to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (format[next] == '0') {
        leadingzero = 1;
        next++;
    }
    numptr = format+next;
    val = strtol(numptr,&endptr,10);
    if ( endptr != numptr) {
        fixedlen = val;
    }
    next = (endptr - format);
    /*  Following is lx lu or u or llx llu , we take
        all this to mean 64 bits, */
#ifdef _WIN32
    if (format[next] == 'I') {
        /*lcount++;*/
        next++;
    }
    if (format[next] == '6') {
        /*lcount++;*/
        next++;
    }
    if (format[next] == '4') {
        /*lcount++;*/
        next++;
    }
#endif /* _WIN32 */
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'u') {
        ucount++;
        next++;
    }
    if (format[next] == 'd') {
        dcount++;
        next++;
    }
    if (format[next] == 'x') {
        xcount++;
        next++;
    }
    if (format[next] == 'X') {
        Xcount++;
        next++;
    }
    if (format[next] == 's') {
        DWSERR("<DWARFSTRINGERR: format percent-s passed to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if ( (Xcount +xcount+dcount+ucount) > 1) {
        DWSERR("<DWARFSTRINGERR: format  percent -x X d u repeats to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if ( (Xcount +xcount+dcount+ucount) == 0) {
        DWSERR("<DWARFSTRINGERR: format percent x X d u missing to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (lcount > 2) {
        DWSERR("<DWARFSTRINGERR: format percent lll to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (dcount > 0) {
        DWSERR("<DWARFSTRINGERR: format  percent-d to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (ucount) {
        divisor = 10;
        ctable = dtable;
    } else {
        divisor = 16;
        if (xcount) {
            ctable = xtable;
        } else {
            ctable = Xtable;
        }
    }
    {
        char digbuf[36];
        char *digptr = 0;
        unsigned digcharlen = 0;
        dwarfstring_u remaining = v;

        if (divisor == 16) {
            digptr = digbuf+sizeof(digbuf) -1;
            for ( ;; ) {
                dwarfstring_u dig;
                dig = remaining & 0xf;
                remaining = remaining >> 4;
                *digptr = ctable[dig];
                ++digcharlen;
                if (!remaining) {
                    break;
                }
                --digptr;
            }
        } else {
            digptr = digbuf+sizeof(digbuf) -1;
            *digptr = 0;
            --digptr;
            for ( ;; ) {
                dwarfstring_u dig;
                dig = remaining % divisor;
                remaining /= divisor;
                *digptr = ctable[dig];
                ++digcharlen;
                if (!remaining) {
                    break;
                }
                --digptr;
            }
        }
        if (fixedlen <= digcharlen) {
            dwarfstring_append_length(data,digptr,digcharlen);
        } else {
            if (!leadingzero) {
                size_t justcount = fixedlen - digcharlen;
                _dwarfstring_append_spaces(data,justcount);
                dwarfstring_append_length(data,digptr,digcharlen);
            } else {
                size_t prefixcount = fixedlen - digcharlen;
                _dwarfstring_append_zeros(data,prefixcount);
                dwarfstring_append_length(data,digptr,digcharlen);
            }
        }
    }
    if (format[next]) {
        size_t trailinglen = strlen(format+next);
        dwarfstring_append_length(data,format+next,trailinglen);
    }
    return FALSE;
}